

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

Constraint *
slang::ast::DisableSoftConstraint::fromSyntax(DisableConstraintSyntax *syntax,ASTContext *context)

{
  Compilation *compilation;
  bool bVar1;
  int iVar2;
  RandMode RVar3;
  undefined4 extraout_var;
  DisableSoftConstraint *ctrl;
  Constraint *pCVar4;
  pair<const_slang::ast::Symbol_*,_slang::SourceRange> local_40;
  Expression *args;
  
  compilation = ((context->scope).ptr)->compilation;
  iVar2 = Expression::bind((int)(syntax->name).ptr,(sockaddr *)context,0);
  args = (Expression *)CONCAT44(extraout_var,iVar2);
  ctrl = BumpAllocator::emplace<slang::ast::DisableSoftConstraint,slang::ast::Expression_const&>
                   (&compilation->super_BumpAllocator,args);
  bVar1 = Expression::bad(args);
  if (!bVar1) {
    getConstraintPrimary(&local_40,args);
    if (local_40.first != (Symbol *)0x0) {
      RVar3 = ASTContext::getRandMode(context,local_40.first);
      if (RVar3 == Rand) {
        return &ctrl->super_Constraint;
      }
    }
    ASTContext::addDiag(context,(DiagCode)0x20008,local_40.second);
  }
  pCVar4 = Constraint::badConstraint(compilation,&ctrl->super_Constraint);
  return pCVar4;
}

Assistant:

Constraint& DisableSoftConstraint::fromSyntax(const DisableConstraintSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto& expr = Expression::bind(*syntax.name, context);
    auto result = comp.emplace<DisableSoftConstraint>(expr);
    if (expr.bad())
        return badConstraint(comp, result);

    auto [sym, sourceRange] = getConstraintPrimary(expr);
    if (!sym || context.getRandMode(*sym) != RandMode::Rand) {
        context.addDiag(diag::BadDisableSoft, sourceRange);
        return badConstraint(comp, result);
    }

    return *result;
}